

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O2

int uv_mutex_init_recursive(uv_mutex_t *mutex)

{
  int iVar1;
  int iVar2;
  pthread_mutexattr_t attr;
  
  iVar1 = pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  if (iVar1 == 0) {
    iVar1 = pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
    if (iVar1 == 0) {
      iVar1 = pthread_mutex_init((pthread_mutex_t *)mutex,(pthread_mutexattr_t *)&attr);
      iVar2 = pthread_mutexattr_destroy((pthread_mutexattr_t *)&attr);
      if (iVar2 == 0) {
        return -iVar1;
      }
    }
  }
  abort();
}

Assistant:

int uv_mutex_init_recursive(uv_mutex_t* mutex) {
  pthread_mutexattr_t attr;
  int err;

  if (pthread_mutexattr_init(&attr))
    abort();

  if (pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE))
    abort();

  err = pthread_mutex_init(mutex, &attr);

  if (pthread_mutexattr_destroy(&attr))
    abort();

  return UV__ERR(err);
}